

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

int recff_metacall(jit_State *J,RecordFFData *rd,MMS mm)

{
  TRef *pTVar1;
  TValue TVar2;
  int iVar3;
  RecordIndex ix;
  TValue local_60 [3];
  TValue local_48;
  TRef local_30;
  TRef local_20;
  
  local_30 = *J->base;
  local_60[0] = *rd->argv;
  iVar3 = lj_record_mm_lookup(J,(RecordIndex *)&local_60[0].gcr,mm);
  if (iVar3 == 0) {
    iVar3 = 0;
  }
  else {
    pTVar1 = J->base;
    pTVar1[2] = *pTVar1;
    *pTVar1 = local_20;
    TVar2 = *rd->argv;
    rd->argv[2] = TVar2;
    *rd->argv = local_48;
    iVar3 = lj_vm_cpcall(J->L,0,J,recff_metacall_cp);
    *rd->argv = TVar2;
    if (iVar3 != 0) {
      lj_err_throw(J->L,iVar3);
    }
    rd->nres = -1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int recff_metacall(jit_State *J, RecordFFData *rd, MMS mm)
{
  RecordIndex ix;
  ix.tab = J->base[0];
  copyTV(J->L, &ix.tabv, &rd->argv[0]);
  if (lj_record_mm_lookup(J, &ix, mm)) {  /* Has metamethod? */
    int errcode;
    TValue argv0;
    /* Temporarily insert metamethod below object. */
    J->base[1+LJ_FR2] = J->base[0];
    J->base[0] = ix.mobj;
    copyTV(J->L, &argv0, &rd->argv[0]);
    copyTV(J->L, &rd->argv[1+LJ_FR2], &rd->argv[0]);
    copyTV(J->L, &rd->argv[0], &ix.mobjv);
    /* Need to protect lj_record_tailcall because it may throw. */
    errcode = lj_vm_cpcall(J->L, NULL, J, recff_metacall_cp);
    /* Always undo Lua stack changes to avoid confusing the interpreter. */
    copyTV(J->L, &rd->argv[0], &argv0);
    if (errcode)
      lj_err_throw(J->L, errcode);  /* Propagate errors. */
    rd->nres = -1;  /* Pending call. */
    return 1;  /* Tailcalled to metamethod. */
  }
  return 0;
}